

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int WebRtcIsac_EncodeUb16
              (TransformTables *transform_tables,float *in,ISACUBEncStruct *ISACencUB_obj,
              int32_t jitterInfo)

{
  uint32_t uVar1;
  int16_t iVar2;
  ushort payloadLimitBytes_00;
  double signal_noise_ratio;
  int bytesLeftSpecCoding;
  int16_t kAveragePitchGain;
  double s2nr;
  undefined1 local_1858 [6];
  uint16_t payloadLimitBytes;
  transcode_obj transcodingParam;
  double lpcGains [12];
  double corr [12] [5];
  double varscale [2];
  int16_t local_1588 [2];
  int status;
  int16_t fim [240];
  int16_t fre [240];
  double LP_lookahead [480];
  double percepFilterParams [65];
  double local_b8;
  double lpcVecs [16];
  int local_30;
  int k;
  int err;
  int32_t jitterInfo_local;
  ISACUBEncStruct *ISACencUB_obj_local;
  float *in_local;
  TransformTables *transform_tables_local;
  
  memcpy(ISACencUB_obj->data_buffer_float + ISACencUB_obj->buffer_index,in,0x280);
  if (ISACencUB_obj->buffer_index + 0xa0 < 0x1e0) {
    ISACencUB_obj->buffer_index = ISACencUB_obj->buffer_index + 0xa0;
    transform_tables_local._4_4_ = 0;
  }
  else {
    WebRtcIsac_ResetBitstream(&ISACencUB_obj->bitstr_obj);
    WebRtcIsac_EncodeJitterInfo(jitterInfo,&ISACencUB_obj->bitstr_obj);
    iVar2 = WebRtcIsac_EncodeBandwidth(isac16kHz,&ISACencUB_obj->bitstr_obj);
    transform_tables_local._4_4_ = (int)iVar2;
    if (-1 < transform_tables_local._4_4_) {
      signal_noise_ratio = WebRtcIsac_GetSnr(ISACencUB_obj->bottleneck,0x1e0);
      local_b8 = ISACencUB_obj->lastLPCVec[0];
      lpcVecs[0] = ISACencUB_obj->lastLPCVec[1];
      lpcVecs[1] = ISACencUB_obj->lastLPCVec[2];
      lpcVecs[2] = ISACencUB_obj->lastLPCVec[3];
      for (lpcVecs[0xf]._4_4_ = 0; lpcVecs[0xf]._4_4_ < 0x1e0;
          lpcVecs[0xf]._4_4_ = lpcVecs[0xf]._4_4_ + 1) {
        LP_lookahead[(long)lpcVecs[0xf]._4_4_ + -1] =
             (double)ISACencUB_obj->data_buffer_float[lpcVecs[0xf]._4_4_ + 0x18];
      }
      WebRtcIsac_GetLpcCoefUb
                ((double *)(fre + 0xec),&ISACencUB_obj->maskfiltstr_obj,lpcVecs + 3,
                 (double (*) [5])(lpcGains + 0xb),corr[0xb] + 4,0x10);
      ISACencUB_obj->lastLPCVec[0] = lpcVecs[0xb];
      ISACencUB_obj->lastLPCVec[1] = lpcVecs[0xc];
      ISACencUB_obj->lastLPCVec[2] = lpcVecs[0xd];
      ISACencUB_obj->lastLPCVec[3] = lpcVecs[0xe];
      WebRtcIsac_EncodeLpcUB
                (&local_b8,&ISACencUB_obj->bitstr_obj,LP_lookahead + 0x1df,0x10,
                 &ISACencUB_obj->SaveEnc_obj);
      WebRtcIsac_GetLpcGain
                (signal_noise_ratio,percepFilterParams + 4,0xc,
                 (double *)&transcodingParam.stream_index,(double (*) [5])(lpcGains + 0xb),
                 corr[0xb] + 4);
      transcodingParam.W_upper = (ISACencUB_obj->bitstr_obj).stream_index;
      transcodingParam.hiFiltGain[5]._0_4_ = (ISACencUB_obj->bitstr_obj).W_upper;
      transcodingParam.hiFiltGain[5]._4_4_ = (ISACencUB_obj->bitstr_obj).streamval;
      transcodingParam.streamval._0_1_ =
           (ISACencUB_obj->bitstr_obj).stream[(ISACencUB_obj->bitstr_obj).stream_index - 2];
      transcodingParam.streamval._1_1_ =
           (ISACencUB_obj->bitstr_obj).stream[(ISACencUB_obj->bitstr_obj).stream_index - 1];
      transcodingParam.streamval._2_1_ =
           (ISACencUB_obj->bitstr_obj).stream[(ISACencUB_obj->bitstr_obj).stream_index];
      for (lpcVecs[0xf]._4_4_ = 0; lpcVecs[0xf]._4_4_ < 6;
          lpcVecs[0xf]._4_4_ = lpcVecs[0xf]._4_4_ + 1) {
        transcodingParam.loFiltGain[(long)lpcVecs[0xf]._4_4_ + -1] =
             transcodingParam.hiFiltGain[(long)lpcVecs[0xf]._4_4_ + 7];
        transcodingParam.loFiltGain[(long)lpcVecs[0xf]._4_4_ + 5] =
             transcodingParam.hiFiltGain[(long)(lpcVecs[0xf]._4_4_ + 6) + 7];
      }
      memcpy((ISACencUB_obj->SaveEnc_obj).lpcGain,&transcodingParam.stream_index,0x60);
      WebRtcIsac_EncodeLpcGainUb
                ((double *)&transcodingParam.stream_index,&ISACencUB_obj->bitstr_obj,
                 (ISACencUB_obj->SaveEnc_obj).lpcGainIndex);
      WebRtcIsac_EncodeLpcGainUb
                (lpcGains + 5,&ISACencUB_obj->bitstr_obj,
                 (ISACencUB_obj->SaveEnc_obj).lpcGainIndex + 6);
      payloadLimitBytes_00 = (ISACencUB_obj->maxPayloadSizeBytes - ISACencUB_obj->numBytesUsed) - 3;
      uVar1 = (ISACencUB_obj->bitstr_obj).stream_index;
      for (lpcVecs[0xf]._4_4_ = 0; lpcVecs[0xf]._4_4_ < 0xc;
          lpcVecs[0xf]._4_4_ = lpcVecs[0xf]._4_4_ + 1) {
        LP_lookahead[(long)(lpcVecs[0xf]._4_4_ * 5 + 5) + 0x1df] =
             transcodingParam.hiFiltGain[(long)lpcVecs[0xf]._4_4_ + 7];
      }
      WebRtcIsac_NormLatticeFilterMa
                (4,(ISACencUB_obj->maskfiltstr_obj).PreStateLoF,
                 (ISACencUB_obj->maskfiltstr_obj).PreStateLoG,ISACencUB_obj->data_buffer_float,
                 percepFilterParams + 4,(double *)(fre + 0xec));
      WebRtcIsac_NormLatticeFilterMa
                (4,(ISACencUB_obj->maskfiltstr_obj).PreStateLoF,
                 (ISACencUB_obj->maskfiltstr_obj).PreStateLoG,
                 ISACencUB_obj->data_buffer_float + 0xf0,percepFilterParams + 0x22,
                 LP_lookahead + 0xef);
      WebRtcIsac_Time2Spec
                (transform_tables,(double *)(fre + 0xec),LP_lookahead + 0xef,fim + 0xec,local_1588,
                 &ISACencUB_obj->fftstr_obj);
      memcpy((ISACencUB_obj->SaveEnc_obj).realFFT,fim + 0xec,0x1e0);
      memcpy((ISACencUB_obj->SaveEnc_obj).imagFFT,local_1588,0x1e0);
      memcpy(ISACencUB_obj->data_buffer_float,ISACencUB_obj->data_buffer_float + 0x1e0,0xc0);
      ISACencUB_obj->buffer_index = 0x30;
      memcpy(&(ISACencUB_obj->SaveEnc_obj).bitStreamObj,ISACencUB_obj,0x264);
      local_30 = WebRtcIsac_EncodeSpec
                           (fim + 0xec,local_1588,0,kIsacUpperBand16,&ISACencUB_obj->bitstr_obj);
      if ((-1 < local_30) || (transform_tables_local._4_4_ = local_30, local_30 == -0x1928)) {
        if (((uint)payloadLimitBytes_00 < (ISACencUB_obj->bitstr_obj).stream_index) ||
           (local_30 == -0x1928)) {
          local_30 = LimitPayloadUb(ISACencUB_obj,payloadLimitBytes_00,
                                    (double)(int)(payloadLimitBytes_00 - uVar1),
                                    (transcode_obj *)local_1858,fim + 0xec,local_1588,
                                    (double *)&transcodingParam.stream_index,kIsacUpperBand16,
                                    local_30);
        }
        if (local_30 < 0) {
          transform_tables_local._4_4_ = local_30;
        }
        else {
          transform_tables_local._4_4_ = WebRtcIsac_EncTerminate(&ISACencUB_obj->bitstr_obj);
        }
      }
    }
  }
  return transform_tables_local._4_4_;
}

Assistant:

int WebRtcIsac_EncodeUb16(const TransformTables* transform_tables,
                          float* in, ISACUBEncStruct* ISACencUB_obj,
                          int32_t jitterInfo) {
  int err;
  int k;

  double lpcVecs[UB_LPC_ORDER * UB16_LPC_VEC_PER_FRAME];
  double percepFilterParams[(1 + UB_LPC_ORDER) * (SUBFRAMES << 1) +
                            (1 + UB_LPC_ORDER)];

  double LP_lookahead[FRAMESAMPLES];
  int16_t fre[FRAMESAMPLES_HALF];   /* Q7 */
  int16_t fim[FRAMESAMPLES_HALF];   /* Q7 */

  int status = 0;

  double varscale[2];
  double corr[SUBFRAMES << 1][UB_LPC_ORDER + 1];
  double lpcGains[SUBFRAMES << 1];
  transcode_obj transcodingParam;
  uint16_t payloadLimitBytes;
  double s2nr;
  const int16_t kAveragePitchGain = 0.0;
  int bytesLeftSpecCoding;

  /* Buffer speech samples (by 10ms packet) until the frame-length is   */
  /* reached (30 ms).                                                   */
  /*********************************************************************/

  /* fill the buffer with 10ms input data */
  memcpy(&ISACencUB_obj->data_buffer_float[ISACencUB_obj->buffer_index], in,
         FRAMESAMPLES_10ms * sizeof(float));

  /* If buffer size is not equal to current frame-size, and end of file is
   * not reached yet, we don't do encoding unless we have the whole frame. */
  if (ISACencUB_obj->buffer_index + FRAMESAMPLES_10ms < FRAMESAMPLES) {
    ISACencUB_obj->buffer_index += FRAMESAMPLES_10ms;
    return 0;
  }

  /* End of buffer function. */
  /**************************/

  /* Encoding */
  /************/

  /* Reset bit-stream */
  WebRtcIsac_ResetBitstream(&(ISACencUB_obj->bitstr_obj));

  /* Encoding of bandwidth information. */
  WebRtcIsac_EncodeJitterInfo(jitterInfo, &ISACencUB_obj->bitstr_obj);

  status = WebRtcIsac_EncodeBandwidth(isac16kHz, &ISACencUB_obj->bitstr_obj);
  if (status < 0) {
    return status;
  }

  s2nr = WebRtcIsac_GetSnr(ISACencUB_obj->bottleneck, FRAMESAMPLES);

  memcpy(lpcVecs, ISACencUB_obj->lastLPCVec, UB_LPC_ORDER * sizeof(double));

  for (k = 0; k < FRAMESAMPLES; k++) {
    LP_lookahead[k] = ISACencUB_obj->data_buffer_float[UB_LOOKAHEAD + k];
  }

  /* Find coefficients for perceptual pre-filters. */
  WebRtcIsac_GetLpcCoefUb(LP_lookahead, &ISACencUB_obj->maskfiltstr_obj,
                          &lpcVecs[UB_LPC_ORDER], corr, varscale, isac16kHz);

  memcpy(ISACencUB_obj->lastLPCVec,
         &lpcVecs[(UB16_LPC_VEC_PER_FRAME - 1) * (UB_LPC_ORDER)],
         sizeof(double) * UB_LPC_ORDER);

  /* Code LPC model and shape - gains not quantized yet. */
  WebRtcIsac_EncodeLpcUB(lpcVecs, &ISACencUB_obj->bitstr_obj,
                         percepFilterParams, isac16kHz,
                         &ISACencUB_obj->SaveEnc_obj);

  /* the first set of lpc parameters are from the last sub-frame of
   * the previous frame. so we don't care about them. */
  WebRtcIsac_GetLpcGain(s2nr, &percepFilterParams[UB_LPC_ORDER + 1],
                        (SUBFRAMES << 1), lpcGains, corr, varscale);

  /* Store the state of arithmetic coder before coding LPC gains */
  transcodingParam.stream_index = ISACencUB_obj->bitstr_obj.stream_index;
  transcodingParam.W_upper = ISACencUB_obj->bitstr_obj.W_upper;
  transcodingParam.streamval = ISACencUB_obj->bitstr_obj.streamval;
  transcodingParam.stream[0] =
      ISACencUB_obj->bitstr_obj.stream[ISACencUB_obj->bitstr_obj.stream_index -
                                       2];
  transcodingParam.stream[1] =
      ISACencUB_obj->bitstr_obj.stream[ISACencUB_obj->bitstr_obj.stream_index -
                                       1];
  transcodingParam.stream[2] =
      ISACencUB_obj->bitstr_obj.stream[ISACencUB_obj->bitstr_obj.stream_index];

  /* Store LPC Gains before encoding them. */
  for (k = 0; k < SUBFRAMES; k++) {
    transcodingParam.loFiltGain[k] = lpcGains[k];
    transcodingParam.hiFiltGain[k] = lpcGains[SUBFRAMES + k];
  }

  /* Store the gains for multiple encoding. */
  memcpy(ISACencUB_obj->SaveEnc_obj.lpcGain, lpcGains,
         (SUBFRAMES << 1) * sizeof(double));

  WebRtcIsac_EncodeLpcGainUb(lpcGains, &ISACencUB_obj->bitstr_obj,
                             ISACencUB_obj->SaveEnc_obj.lpcGainIndex);
  WebRtcIsac_EncodeLpcGainUb(
      &lpcGains[SUBFRAMES], &ISACencUB_obj->bitstr_obj,
      &ISACencUB_obj->SaveEnc_obj.lpcGainIndex[SUBFRAMES]);

  /* Get the correct value for the payload limit and calculate the number of
     bytes left for coding the spectrum. It is a 30ms frame
     Subract 3 because termination process may add 3 bytes */
  payloadLimitBytes = ISACencUB_obj->maxPayloadSizeBytes -
      ISACencUB_obj->numBytesUsed - 3;
  bytesLeftSpecCoding = payloadLimitBytes -
        ISACencUB_obj->bitstr_obj.stream_index;

  for (k = 0; k < (SUBFRAMES << 1); k++) {
    percepFilterParams[k * (UB_LPC_ORDER + 1) + (UB_LPC_ORDER + 1)] =
        lpcGains[k];
  }

  /* LPC filtering (using normalized lattice filter), */
  /* first half-frame. */
  WebRtcIsac_NormLatticeFilterMa(UB_LPC_ORDER,
                                 ISACencUB_obj->maskfiltstr_obj.PreStateLoF,
                                 ISACencUB_obj->maskfiltstr_obj.PreStateLoG,
                                 &ISACencUB_obj->data_buffer_float[0],
                                 &percepFilterParams[UB_LPC_ORDER + 1],
                                 &LP_lookahead[0]);

  /* Second half-frame filtering. */
  WebRtcIsac_NormLatticeFilterMa(
      UB_LPC_ORDER, ISACencUB_obj->maskfiltstr_obj.PreStateLoF,
      ISACencUB_obj->maskfiltstr_obj.PreStateLoG,
      &ISACencUB_obj->data_buffer_float[FRAMESAMPLES_HALF],
      &percepFilterParams[(UB_LPC_ORDER + 1) + SUBFRAMES * (UB_LPC_ORDER + 1)],
      &LP_lookahead[FRAMESAMPLES_HALF]);

  WebRtcIsac_Time2Spec(transform_tables,
                       &LP_lookahead[0], &LP_lookahead[FRAMESAMPLES_HALF],
                       fre, fim, &ISACencUB_obj->fftstr_obj);

  /* Store FFT coefficients for multiple encoding. */
  memcpy(ISACencUB_obj->SaveEnc_obj.realFFT, fre, sizeof(fre));
  memcpy(ISACencUB_obj->SaveEnc_obj.imagFFT, fim, sizeof(fim));

  /* Prepare the audio buffer for the next packet
   * move the last 3 ms to the beginning of the buffer. */
  memcpy(ISACencUB_obj->data_buffer_float,
         &ISACencUB_obj->data_buffer_float[FRAMESAMPLES],
         LB_TOTAL_DELAY_SAMPLES * sizeof(float));
  /* start writing with 3 ms delay to compensate for the delay
   * of the lower-band. */
  ISACencUB_obj->buffer_index = LB_TOTAL_DELAY_SAMPLES;

  /* Save the bit-stream object at this point for FEC. */
  memcpy(&ISACencUB_obj->SaveEnc_obj.bitStreamObj, &ISACencUB_obj->bitstr_obj,
         sizeof(Bitstr));

  /* Qantization and lossless coding */
  /* Note that there is no pitch-gain for this band so kAveragePitchGain = 0
   * is passed to the function. In fact, the function ignores the 3rd parameter
   * for this band. */
  err = WebRtcIsac_EncodeSpec(fre, fim, kAveragePitchGain, kIsacUpperBand16,
                              &ISACencUB_obj->bitstr_obj);
  if ((err < 0) && (err != -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
    return err;
  }

  if ((ISACencUB_obj->bitstr_obj.stream_index > payloadLimitBytes) ||
      (err == -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
    err = LimitPayloadUb(ISACencUB_obj, payloadLimitBytes, bytesLeftSpecCoding,
                         &transcodingParam, fre, fim, lpcGains,
                         kIsacUpperBand16, err);
  }
  if (err < 0) {
    return err;
  }
  /* Complete arithmetic coding. */
  return WebRtcIsac_EncTerminate(&ISACencUB_obj->bitstr_obj);
}